

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

XMLComment * __thiscall tinyxml2::XMLDocument::NewComment(XMLDocument *this,char *str)

{
  XMLComment *pXVar1;
  
  pXVar1 = CreateUnlinkedNode<tinyxml2::XMLComment,104>(this,&this->_commentPool);
  StrPair::SetStr(&(pXVar1->super_XMLNode)._value,str,0);
  return pXVar1;
}

Assistant:

XMLComment* XMLDocument::NewComment(const char* str)
{
    XMLComment* comment = CreateUnlinkedNode<XMLComment>(_commentPool);
    comment->SetValue(str);
    return comment;
}